

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::~IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x12];
  *(void **)&this->field_0x10 = vtt[0x13];
  *(void **)&this->field_0x70 = vtt[0x14];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x15];
  std::__cxx11::string::~string
            ((string *)
             &(this->
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
              field_0x20);
  IfcStyledItem::~IfcStyledItem((IfcStyledItem *)this,vtt + 2);
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}